

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

string * __thiscall
kratos::InterfaceModPortDefinition::def_name_abi_cxx11_
          (string *__return_storage_ptr__,InterfaceModPortDefinition *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  long *local_68;
  undefined8 uStack_60;
  pointer local_58;
  size_type sStack_50;
  long *local_40;
  undefined8 uStack_38;
  long local_30 [2];
  
  (*(((this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->super_IDefinition)._vptr_IDefinition[7])(&local_40);
  local_58 = (this->name_)._M_dataplus._M_p;
  sStack_50 = (this->name_)._M_string_length;
  local_68 = local_40;
  uStack_60 = uStack_38;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x7;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x2422c5,format_str,args);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InterfaceModPortDefinition::def_name() const {
    return ::format("{0}.{1}", def_->def_name(), name_);
}